

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall Png::Png(Png *this,path *filePath)

{
  default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  uint uVar1;
  path *__file;
  png_uint_32 y_00;
  uint uVar2;
  char cVar3;
  _Ios_Openmode __oflag;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  char *pcVar7;
  int *piVar8;
  char *pcVar9;
  streambuf *psVar10;
  pointer pvVar11;
  size_type sVar12;
  size_type sVar13;
  png_structp ppVar14;
  png_infop ppVar15;
  pointer __n;
  uchar *puVar16;
  reference pvVar17;
  png_colorp ppVar18;
  byte local_290;
  byte local_28c;
  byte local_288;
  byte local_27c;
  byte local_274;
  byte local_268;
  char *local_208;
  uint local_1f8;
  Rgba local_138;
  uint local_134;
  uchar *puStack_130;
  png_uint_32 x_1;
  png_bytep ptr;
  int local_120;
  png_uint_32 y_1;
  png_uint_32 yStep;
  png_uint_32 xStep;
  int pass;
  uint local_10c;
  png_uint_32 x;
  png_uint_32 y;
  anon_class_24_3_904f71aa assignColor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indeterminates;
  vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
  conflicts;
  undefined1 local_b8 [8];
  DefaultInitVec<png_byte> row;
  size_t nbRowBytes;
  png_color *color;
  int i;
  int nbTransparentEntries;
  anon_class_8_1_7f08976d interlaceTypeName;
  anon_class_8_1_8991fb9c colorTypeName;
  int interlaceType;
  int bitDepth;
  array<unsigned_char,_8UL> local_50;
  array<unsigned_char,_8UL> pngHeader;
  path *filePath_local;
  Png *this_local;
  
  this->path = filePath;
  File::File(&this->file);
  this->png = (png_structp)0x0;
  this->info = (png_infop)0x0;
  std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::vector(&this->pixels);
  memset(&this->colors,0,0x28005);
  ImagePalette::ImagePalette(&this->colors);
  this->embeddedPal = (png_colorp)0x0;
  this->transparencyPal = (png_bytep)0x0;
  __file = this->path;
  __oflag = std::operator|(_S_in,_S_bin);
  iVar4 = File::open(&this->file,(char *)__file,__oflag);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    File::string((string *)&pngHeader,&this->file,this->path);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pngHeader);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    fatal("Failed to open input image (\"%s\"): %s",pcVar7,pcVar9);
  }
  Options::verbosePrint(&options,'\x02',"Opened input file\n");
  psVar10 = File::operator->(&this->file);
  pvVar11 = std::array<unsigned_char,_8UL>::data(&local_50);
  std::array<unsigned_char,_8UL>::size(&local_50);
  sVar12 = std::streambuf::sgetn((char *)psVar10,(long)pvVar11);
  sVar13 = std::array<unsigned_char,_8UL>::size(&local_50);
  if (sVar12 == sVar13) {
    pvVar11 = std::array<unsigned_char,_8UL>::data(&local_50);
    sVar12 = std::array<unsigned_char,_8UL>::size(&local_50);
    iVar4 = png_sig_cmp(pvVar11,0,sVar12);
    if (iVar4 == 0) {
      Options::verbosePrint(&options,'\x03',"PNG header signature is OK\n");
      ppVar14 = (png_structp)png_create_read_struct("1.6.37",this,handleError,handleWarning);
      this->png = ppVar14;
      if (this->png == (png_structp)0x0) {
        piVar8 = __errno_location();
        pcVar7 = strerror(*piVar8);
        fatal("Failed to allocate PNG structure: %s",pcVar7);
      }
      ppVar15 = (png_infop)png_create_info_struct(this->png);
      this->info = ppVar15;
      if (this->info == (png_infop)0x0) {
        png_destroy_read_struct(&this->png,0);
        piVar8 = __errno_location();
        pcVar7 = strerror(*piVar8);
        fatal("Failed to allocate PNG info structure: %s",pcVar7);
      }
      png_set_read_fn(this->png,this,readData);
      ppVar14 = this->png;
      sVar12 = std::array<unsigned_char,_8UL>::size(&local_50);
      png_set_sig_bytes(ppVar14,sVar12 & 0xffffffff);
      png_read_info(this->png,this->info);
      png_get_IHDR(this->png,this->info,&this->width,&this->height,
                   (undefined1 *)((long)&colorTypeName.this + 4),&this->colorType,&colorTypeName,0,0
                  );
      if ((options.inputSlice.width == 0) && ((this->width & 7) != 0)) {
        fatal("Image width (%u pixels) is not a multiple of 8!",(ulong)this->width);
      }
      if ((options.inputSlice.height == 0) && ((this->height & 7) != 0)) {
        fatal("Image height (%u pixels) is not a multiple of 8!",(ulong)this->height);
      }
      std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::resize
                (&this->pixels,(ulong)this->width * (ulong)this->height);
      uVar2 = colorTypeName.this._4_4_;
      _i = (int *)&colorTypeName;
      uVar5 = this->width;
      uVar1 = this->height;
      interlaceTypeName.interlaceType = (int *)this;
      pcVar7 = Png::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)&interlaceTypeName);
      pcVar9 = Png::anon_class_8_1_7f08976d::operator()((anon_class_8_1_7f08976d *)&i);
      Options::verbosePrint
                (&options,'\x03',"Input image: %ux%u pixels, %dbpp %s, %s\n",(ulong)uVar5,
                 (ulong)uVar1,(ulong)uVar2,pcVar7,pcVar9);
      iVar4 = png_get_PLTE(this->png,this->info,&this->embeddedPal,&this->nbColors);
      if (iVar4 == 0) {
        Options::verbosePrint(&options,'\x03',"No embedded palette\n");
      }
      else {
        iVar4 = png_get_tRNS(this->png,this->info,&this->transparencyPal,(long)&color + 4,0);
        if ((iVar4 != 0) && (color._4_4_ != this->nbColors)) {
          __assert_fail("nbTransparentEntries == nbColors",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x107,"Png");
        }
        Options::verbosePrint
                  (&options,'\x03',"Embedded palette has %d colors: [",(ulong)(uint)this->nbColors);
        for (color._0_4_ = 0; (int)color < this->nbColors; color._0_4_ = (int)color + 1) {
          ppVar18 = this->embeddedPal + (int)color;
          if (this->transparencyPal == (png_bytep)0x0) {
            local_1f8 = 0xff;
          }
          else {
            local_1f8 = (uint)this->transparencyPal[(int)color];
          }
          if ((int)color == this->nbColors + -1) {
            local_208 = "]\n";
          }
          else {
            local_208 = ", ";
          }
          pcVar7 = (char *)CONCAT44((int)((ulong)pcVar7 >> 0x20),local_1f8);
          Options::verbosePrint
                    (&options,'\x03',"#%02x%02x%02x%02x%s",(ulong)ppVar18->red,(ulong)ppVar18->green
                     ,(ulong)ppVar18->blue,pcVar7,local_208);
        }
      }
      uVar5 = this->colorType & 0xfffffffb;
      if (uVar5 == 0) {
        png_set_gray_to_rgb(this->png);
      }
      else if (uVar5 == 3) {
        png_set_palette_to_rgb(this->png);
      }
      iVar4 = png_get_valid(this->png,this->info,0x10);
      if (iVar4 == 0) {
        if ((this->colorType & 4U) == 0) {
          png_set_add_alpha(this->png,0xffff,1);
        }
      }
      else {
        png_set_tRNS_to_alpha(this->png);
      }
      if (colorTypeName.this._4_4_ == 0x10) {
        png_set_scale_16(this->png);
      }
      else if ((int)colorTypeName.this._4_4_ < 8) {
        png_set_packing(this->png);
      }
      png_read_update_info(this->png,this->info);
      uVar6 = png_get_image_width(this->png,this->info);
      if (uVar6 != this->width) {
        __assert_fail("png_get_image_width(png, info) == width",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x138,"Png");
      }
      uVar6 = png_get_image_height(this->png,this->info);
      if (uVar6 != this->height) {
        __assert_fail("png_get_image_height(png, info) == height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x139,"Png");
      }
      cVar3 = png_get_color_type(this->png,this->info);
      if (cVar3 != '\x06') {
        __assert_fail("png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x13b,"Png");
      }
      cVar3 = png_get_bit_depth(this->png,this->info);
      if (cVar3 != '\b') {
        __assert_fail("png_get_bit_depth(png, info) == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x13c,"Png");
      }
      __n = (pointer)png_get_rowbytes(this->png,this->info);
      row.
      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __n;
      if (__n != (pointer)0x0) {
        this_00 = (default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *)
                  ((long)&conflicts.
                          super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>::
        default_init_allocator(this_00);
        std::
        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::vector((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_b8,(size_type)__n,this_00);
        default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>::
        ~default_init_allocator
                  ((default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&conflicts.
                           super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
        ::vector((vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                  *)&indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &assignColor.indeterminates);
        assignColor.this =
             (Png *)&indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        assignColor.conflicts =
             (vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
              *)&assignColor.indeterminates;
        _x = this;
        if ((int)colorTypeName.this == 0) {
          for (local_10c = 0; local_10c < this->height; local_10c = local_10c + 1) {
            ppVar14 = this->png;
            puVar16 = std::
                      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::data((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_b8);
            png_read_row(ppVar14,puVar16,0);
            for (pass = 0; uVar5 = local_10c, iVar4 = pass, (uint)pass < this->width;
                pass = pass + 1) {
              pvVar17 = std::
                        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[]((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)local_b8,(ulong)(uint)(pass << 2));
              r = *pvVar17;
              pvVar17 = std::
                        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[]((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)local_b8,(ulong)(pass * 4 + 1));
              g = *pvVar17;
              pvVar17 = std::
                        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[]((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)local_b8,(ulong)(pass * 4 + 2));
              b = *pvVar17;
              pvVar17 = std::
                        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[]((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)local_b8,(ulong)(pass * 4 + 3));
              Rgba::Rgba((Rgba *)&xStep,r,g,b,*pvVar17);
              Png::anon_class_24_3_904f71aa::operator()
                        ((anon_class_24_3_904f71aa *)&x,iVar4,uVar5,(Rgba *)&xStep);
            }
          }
        }
        else {
          if ((int)colorTypeName.this != 1) {
            __assert_fail("interlaceType == PNG_INTERLACE_ADAM7",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x171,"Png");
          }
          for (yStep = 0; (int)yStep < 7; yStep = yStep + 1) {
            if ((int)yStep < 2) {
              local_268 = 3;
            }
            else {
              local_268 = (byte)((int)(7 - yStep) >> 1);
            }
            if ((int)yStep < 2) {
              local_274 = 3;
            }
            else {
              local_274 = (byte)((int)(7 - yStep) >> 1);
            }
            if (this->width +
                (((1 << (local_268 & 0x1f)) + -1) -
                ((yStep & 1) << (3U - (char)((int)(yStep + 1) >> 1) & 0x1f) & 7)) >>
                (local_274 & 0x1f) != 0) {
              if ((int)yStep < 3) {
                local_27c = 3;
              }
              else {
                local_27c = (byte)((int)(8 - yStep) >> 1);
              }
              cVar3 = (char)((int)yStep >> 1);
              if ((int)yStep < 3) {
                local_288 = 3;
              }
              else {
                local_288 = (byte)((int)(8 - yStep) >> 1);
              }
              if (this->height +
                  (((1 << (local_27c & 0x1f)) + -1) -
                  (((yStep ^ 0xffffffff) & 1) << (3U - cVar3 & 0x1f) & 7)) >> (local_288 & 0x1f) !=
                  0) {
                if ((int)yStep < 2) {
                  local_28c = 3;
                }
                else {
                  local_28c = (byte)((int)(7 - yStep) >> 1);
                }
                y_1 = 1 << (local_28c & 0x1f);
                if ((int)yStep < 3) {
                  local_290 = 3;
                }
                else {
                  local_290 = (byte)((int)(8 - yStep) >> 1);
                }
                local_120 = 1 << (local_290 & 0x1f);
                for (ptr._4_4_ = ((yStep ^ 0xffffffff) & 1) << (3U - cVar3 & 0x1f) & 7;
                    ptr._4_4_ < this->height; ptr._4_4_ = local_120 + ptr._4_4_) {
                  puStack_130 = std::
                                vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::data((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)local_b8);
                  png_read_row(this->png,puStack_130,0);
                  for (local_134 = (yStep & 1) << (3U - (char)((int)(yStep + 1) >> 1) & 0x1f) & 7;
                      y_00 = ptr._4_4_, uVar5 = local_134, local_134 < this->width;
                      local_134 = y_1 + local_134) {
                    Rgba::Rgba(&local_138,*puStack_130,puStack_130[1],puStack_130[2],puStack_130[3])
                    ;
                    Png::anon_class_24_3_904f71aa::operator()
                              ((anon_class_24_3_904f71aa *)&x,uVar5,y_00,&local_138);
                    puStack_130 = puStack_130 + 4;
                  }
                }
              }
            }
          }
        }
        png_read_end(this->png,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &assignColor.indeterminates);
        std::
        vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
        ::~vector((vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                   *)&indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~vector((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_b8);
        return;
      }
      __assert_fail("nbRowBytes != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x141,"Png");
    }
  }
  File::string((string *)&interlaceType,&this->file,this->path);
  pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &interlaceType);
  fatal("Input file (\"%s\") is not a PNG image!",pcVar7);
}

Assistant:

explicit Png(std::filesystem::path const &filePath) : path(filePath), colors() {
		if (file.open(path, std::ios_base::in | std::ios_base::binary) == nullptr) {
			fatal("Failed to open input image (\"%s\"): %s", file.string(path).c_str(),
			      strerror(errno));
		}

		options.verbosePrint(Options::VERB_LOG_ACT, "Opened input file\n");

		std::array<unsigned char, 8> pngHeader;

		if (file->sgetn(reinterpret_cast<char *>(pngHeader.data()), pngHeader.size())
		        != static_cast<std::streamsize>(pngHeader.size()) // Not enough bytes?
		    || png_sig_cmp(pngHeader.data(), 0, pngHeader.size()) != 0) {
			fatal("Input file (\"%s\") is not a PNG image!", file.string(path).c_str());
		}

		options.verbosePrint(Options::VERB_INTERM, "PNG header signature is OK\n");

		png = png_create_read_struct(PNG_LIBPNG_VER_STRING, (png_voidp)this, handleError,
		                             handleWarning);
		if (!png) {
			fatal("Failed to allocate PNG structure: %s", strerror(errno));
		}

		info = png_create_info_struct(png);
		if (!info) {
			png_destroy_read_struct(&png, nullptr, nullptr);
			fatal("Failed to allocate PNG info structure: %s", strerror(errno));
		}

		png_set_read_fn(png, this, readData);
		png_set_sig_bytes(png, pngHeader.size());

		// TODO: png_set_crc_action(png, PNG_CRC_ERROR_QUIT, PNG_CRC_WARN_DISCARD);

		// Skipping chunks we don't use should improve performance
		// TODO: png_set_keep_unknown_chunks(png, ...);

		// Process all chunks up to but not including the image data
		png_read_info(png, info);

		int bitDepth, interlaceType; //, compressionType, filterMethod;

		png_get_IHDR(png, info, &width, &height, &bitDepth, &colorType, &interlaceType, nullptr,
		             nullptr);

		if (options.inputSlice.width == 0 && width % 8 != 0) {
			fatal("Image width (%" PRIu32 " pixels) is not a multiple of 8!", width);
		}
		if (options.inputSlice.height == 0 && height % 8 != 0) {
			fatal("Image height (%" PRIu32 " pixels) is not a multiple of 8!", height);
		}

		pixels.resize(static_cast<size_t>(width) * static_cast<size_t>(height));

		auto colorTypeName = [this]() {
			switch (colorType) {
			case PNG_COLOR_TYPE_GRAY:
				return "grayscale";
			case PNG_COLOR_TYPE_GRAY_ALPHA:
				return "grayscale + alpha";
			case PNG_COLOR_TYPE_PALETTE:
				return "palette";
			case PNG_COLOR_TYPE_RGB:
				return "RGB";
			case PNG_COLOR_TYPE_RGB_ALPHA:
				return "RGB + alpha";
			default:
				fatal("Unknown color type %d", colorType);
			}
		};
		auto interlaceTypeName = [&interlaceType]() {
			switch (interlaceType) {
			case PNG_INTERLACE_NONE:
				return "not interlaced";
			case PNG_INTERLACE_ADAM7:
				return "interlaced (Adam7)";
			default:
				fatal("Unknown interlace type %d", interlaceType);
			}
		};
		options.verbosePrint(Options::VERB_INTERM,
		                     "Input image: %" PRIu32 "x%" PRIu32 " pixels, %dbpp %s, %s\n", width,
		                     height, bitDepth, colorTypeName(), interlaceTypeName());

		if (png_get_PLTE(png, info, &embeddedPal, &nbColors) != 0) {
			int nbTransparentEntries;
			if (png_get_tRNS(png, info, &transparencyPal, &nbTransparentEntries, nullptr)) {
				assert(nbTransparentEntries == nbColors);
			}

			options.verbosePrint(Options::VERB_INTERM, "Embedded palette has %d colors: [",
			                     nbColors);
			for (int i = 0; i < nbColors; ++i) {
				auto const &color = embeddedPal[i];
				options.verbosePrint(
				    Options::VERB_INTERM, "#%02x%02x%02x%02x%s", color.red, color.green, color.blue,
				    transparencyPal ? transparencyPal[i] : 0xFF, i != nbColors - 1 ? ", " : "]\n");
			}
		} else {
			options.verbosePrint(Options::VERB_INTERM, "No embedded palette\n");
		}

		// Set up transformations; to turn everything into RGBA888
		// TODO: it's not necessary to uniformize the pixel data (in theory), and not doing
		// so *might* improve performance, and should reduce memory usage.

		// Convert grayscale to RGB
		switch (colorType & ~PNG_COLOR_MASK_ALPHA) {
		case PNG_COLOR_TYPE_GRAY:
			png_set_gray_to_rgb(png); // This also converts tRNS to alpha
			break;
		case PNG_COLOR_TYPE_PALETTE:
			png_set_palette_to_rgb(png);
			break;
		}

		if (png_get_valid(png, info, PNG_INFO_tRNS)) {
			// If we read a tRNS chunk, convert it to alpha
			png_set_tRNS_to_alpha(png);
		} else if (!(colorType & PNG_COLOR_MASK_ALPHA)) {
			// Otherwise, if we lack an alpha channel, default to full opacity
			png_set_add_alpha(png, 0xFFFF, PNG_FILLER_AFTER);
		}

		// Scale 16bpp back to 8 (we don't need all of that precision anyway)
		if (bitDepth == 16) {
			png_set_scale_16(png);
		} else if (bitDepth < 8) {
			png_set_packing(png);
		}

		// Do NOT call `png_set_interlace_handling`. We want to expand the rows ourselves.

		// Update `info` with the transformations
		png_read_update_info(png, info);
		// These shouldn't have changed
		assert(png_get_image_width(png, info) == width);
		assert(png_get_image_height(png, info) == height);
		// These should have changed, however
		assert(png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA);
		assert(png_get_bit_depth(png, info) == 8);

		// Now that metadata has been read, we can process the image data

		size_t nbRowBytes = png_get_rowbytes(png, info);
		assert(nbRowBytes != 0);
		DefaultInitVec<png_byte> row(nbRowBytes);
		// Holds known-conflicting color pairs to avoid warning about them twice.
		// We don't need to worry about transitivity, as ImagePalette slots are immutable once
		// assigned, and conflicts always occur between that and another color.
		// For the same reason, we don't need to worry about order, either.
		std::vector<std::tuple<uint32_t, uint32_t>> conflicts;
		// Holds colors whose alpha value is ambiguous
		std::vector<uint32_t> indeterminates;

		// Assign a color to the given position, and register it in the image palette as well
		auto assignColor = [this, &conflicts, &indeterminates](png_uint_32 x, png_uint_32 y,
		                                                       Rgba &&color) {
			if (!color.isTransparent() && !color.isOpaque()) {
				uint32_t css = color.toCSS();
				if (std::find(indeterminates.begin(), indeterminates.end(), css)
				    == indeterminates.end()) {
					error("Color #%08x is neither transparent (alpha < %u) nor opaque (alpha >= "
					      "%u) [first seen at x: %" PRIu32 ", y: %" PRIu32 "]",
					      css, Rgba::transparency_threshold, Rgba::opacity_threshold, x, y);
					indeterminates.push_back(css);
				}
			} else if (Rgba const *other = colors.registerColor(color); other) {
				std::tuple conflicting{color.toCSS(), other->toCSS()};
				// Do not report combinations twice
				if (std::find(conflicts.begin(), conflicts.end(), conflicting) == conflicts.end()) {
					warning("Fusing colors #%08x and #%08x into Game Boy color $%04x [first seen "
					        "at x: %" PRIu32 ", y: %" PRIu32 "]",
					        std::get<0>(conflicting), std::get<1>(conflicting), color.cgbColor(), x,
					        y);
					// Do not report this combination again
					conflicts.emplace_back(conflicting);
				}
			}

			pixel(x, y) = color;
		};

		if (interlaceType == PNG_INTERLACE_NONE) {
			for (png_uint_32 y = 0; y < height; ++y) {
				png_read_row(png, row.data(), nullptr);

				for (png_uint_32 x = 0; x < width; ++x) {
					assignColor(x, y,
					            Rgba(row[x * 4], row[x * 4 + 1], row[x * 4 + 2], row[x * 4 + 3]));
				}
			}
		} else {
			assert(interlaceType == PNG_INTERLACE_ADAM7);

			// For interlace to work properly, we must read the image `nbPasses` times
			for (int pass = 0; pass < PNG_INTERLACE_ADAM7_PASSES; ++pass) {
				// The interlacing pass must be skipped if its width or height is reported as zero
				if (PNG_PASS_COLS(width, pass) == 0 || PNG_PASS_ROWS(height, pass) == 0) {
					continue;
				}

				png_uint_32 xStep = 1u << PNG_PASS_COL_SHIFT(pass);
				png_uint_32 yStep = 1u << PNG_PASS_ROW_SHIFT(pass);

				for (png_uint_32 y = PNG_PASS_START_ROW(pass); y < height; y += yStep) {
					png_bytep ptr = row.data();
					png_read_row(png, ptr, nullptr);

					for (png_uint_32 x = PNG_PASS_START_COL(pass); x < width; x += xStep) {
						assignColor(x, y, Rgba(ptr[0], ptr[1], ptr[2], ptr[3]));
						ptr += 4;
					}
				}
			}
		}

		// We don't care about chunks after the image data (comments, etc.)
		png_read_end(png, nullptr);
	}